

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

void Gia_ManCountCareBits(Gia_Man_t *p,Vec_Wec_t *vPats)

{
  ulong *puVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong *puVar18;
  long lVar19;
  long lVar20;
  
  iVar9 = vPats->nSize;
  if (iVar9 < 1) {
    uVar6 = 0;
  }
  else {
    lVar19 = 0;
    uVar6 = 0;
    do {
      pVVar11 = vPats->pArray;
      if (pVVar11[lVar19].nSize != p->vCis->nSize) {
        __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x364,"void Gia_ManCountCareBits(Gia_Man_t *, Vec_Wec_t *)");
      }
      *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
      *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffffffffff;
      pVVar10 = p->vCis;
      if (0 < pVVar10->nSize) {
        lVar15 = 0;
        do {
          iVar9 = pVVar10->pArray[lVar15];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0057f14b;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (pVVar11[lVar19].nSize <= lVar15) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pGVar2 = p->pObjs + iVar9;
          *(ulong *)pGVar2 =
               *(ulong *)pGVar2 & 0xbfffffffbfffffff |
               (ulong)((pVVar11[lVar19].pArray[lVar15] & 1U) << 0x1e);
          lVar15 = lVar15 + 1;
          pVVar10 = p->vCis;
        } while (lVar15 < pVVar10->nSize);
      }
      if (0 < p->nObjs) {
        lVar20 = 0;
        lVar15 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)(&pGVar2->field_0x0 + lVar20);
          if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
            *(ulong *)(&pGVar2->field_0x0 + lVar20) =
                 uVar12 & 0xbfffffff3fffffff |
                 (ulong)((((uint)(uVar12 >> 0x3d) ^
                          *(uint *)((long)pGVar2 +
                                   (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3 + lVar20) >>
                          0x1e) & ((uint)(uVar12 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar2 +
                                           (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3 +
                                           lVar20) >> 0x1e) & 1) << 0x1e);
          }
          lVar15 = lVar15 + 1;
          lVar20 = lVar20 + 0xc;
        } while (lVar15 < p->nObjs);
      }
      pVVar11 = p->vCos;
      if (0 < pVVar11->nSize) {
        lVar15 = 0;
        do {
          iVar9 = pVVar11->pArray[lVar15];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0057f14b;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar9;
          uVar7 = (uint)*(ulong *)pGVar2;
          uVar12 = (ulong)(uVar7 & 0x1fffffff);
          *(ulong *)pGVar2 =
               *(ulong *)pGVar2 & 0xffffffffbfffffff |
               (ulong)((uVar7 * 2 ^ *(uint *)(pGVar2 + -uVar12)) & 0x40000000);
          *(ulong *)(pGVar2 + -uVar12) = *(ulong *)(pGVar2 + -uVar12) | 0x4000000000000000;
          lVar15 = lVar15 + 1;
          pVVar11 = p->vCos;
        } while (lVar15 < pVVar11->nSize);
      }
      lVar15 = (long)p->nObjs;
      if (1 < lVar15) {
        lVar20 = lVar15 * 0xc;
        do {
          lVar17 = lVar20 + -0xc;
          if (p->nObjs < lVar15) {
LAB_0057f14b:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)(&pGVar2[-1].field_0x0 + lVar20);
          if ((uVar12 & 0x4000000080000000) == 0x4000000000000000 &&
              (uVar12 & 0x1fffffff) != 0x1fffffff) {
            uVar7 = (int)(uVar12 & 0x1fffffff) << 2;
            puVar1 = (ulong *)((long)pGVar2 + lVar17 + (ulong)uVar7 * -3);
            uVar3 = *(ulong *)((long)pGVar2 + lVar17 + (ulong)uVar7 * -3);
            if (((uint)uVar12 >> 0x1e & 1) == 0) {
              uVar14 = (uint)(uVar3 >> 0x1e) & 1;
              uVar8 = (uint)(uVar12 >> 0x1d) & 7;
              uVar7 = (uint)(uVar12 >> 0x1e) & 0x7ffffffc;
              uVar13 = *(ulong *)((long)pGVar2 + lVar17 + (ulong)uVar7 * -3);
              uVar16 = (uint)(uVar12 >> 0x3d) ^ (uint)(uVar13 >> 0x1e) & 3;
              if ((uVar14 != uVar8) && ((uVar16 & 1) != 0)) {
                __assert_fail("fCompl0 == 0 || fCompl1 == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                              ,899,"void Gia_ManCountCareBits(Gia_Man_t *, Vec_Wec_t *)");
              }
              puVar18 = (ulong *)((long)pGVar2 + lVar17 + (ulong)uVar7 * -3);
              if (((uVar16 & 1) != 0) && (uVar13 = uVar3, puVar18 = puVar1, uVar14 != uVar8))
              goto LAB_0057f05f;
            }
            else {
              *puVar1 = uVar3 | 0x4000000000000000;
              puVar18 = (ulong *)((long)pGVar2 +
                                 (ulong)((*(uint *)(&pGVar2[-1].field_0x4 + lVar20) & 0x1fffffff) <<
                                        2) * -3 + lVar17);
              uVar13 = *puVar18;
            }
            *puVar18 = uVar13 | 0x4000000000000000;
          }
LAB_0057f05f:
          bVar5 = 2 < lVar15;
          lVar15 = lVar15 + -1;
          lVar20 = lVar17;
        } while (bVar5);
      }
      if ((long)p->nObjs < 1) {
        uVar12 = 0;
      }
      else {
        lVar15 = 0;
        uVar12 = 0;
        do {
          if (p->pObjs == (Gia_Obj_t *)0x0) {
            uVar12 = 0;
            break;
          }
          uVar4 = *(undefined8 *)(&p->pObjs->field_0x0 + lVar15);
          uVar8 = (uint)uVar4;
          uVar7 = (uint)((ulong)uVar4 >> 0x3e) & 1;
          if ((~uVar8 & 0x1fffffff) == 0) {
            uVar7 = 0;
          }
          if ((int)uVar8 < 0) {
            uVar7 = 0;
          }
          uVar12 = (ulong)((int)uVar12 + uVar7);
          lVar15 = lVar15 + 0xc;
        } while ((long)p->nObjs * 0xc != lVar15);
      }
      uVar6 = uVar6 + uVar12;
      lVar19 = lVar19 + 1;
      iVar9 = vPats->nSize;
    } while (lVar19 < iVar9);
  }
  uVar6 = uVar6 / (ulong)(long)iVar9;
  printf("Stats over %d patterns: Average care-nodes = %d (%6.2f %%)\n",
         ((double)(int)uVar6 * 100.0) / (double)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),
         (long)iVar9,uVar6 & 0xffffffff);
  return;
}

Assistant:

void Gia_ManCountCareBits( Gia_Man_t * p, Vec_Wec_t * vPats )
{
    Gia_Obj_t * pObj;
    int i, k, fCompl0, fCompl1;
    word Counter = 0;
    Vec_Int_t * vPat;
    Vec_WecForEachLevel( vPats, vPat, i )
    {
        int Count = 0;
        assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );

        // propagate forward
        Gia_ManConst0(p)->fMark0 = 0;
        Gia_ManConst0(p)->fMark1 = 0;
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Vec_IntEntry(vPat, k);
            pObj->fMark1 = 0;
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            pObj->fMark1 = 0;
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ObjFanin0(pObj)->fMark1 = 1;
        }
        // propagate backward
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark1 )
                continue;
            if ( pObj->fMark0 == 0 )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                assert( fCompl0 == 0 || fCompl1 == 0 );
                if ( fCompl1 == 0 )
                    Gia_ObjFanin1(pObj)->fMark1 = 1;
                else if ( fCompl0 == 0 )
                    Gia_ObjFanin0(pObj)->fMark1 = 1;
                
            }
            else
            {
                Gia_ObjFanin0(pObj)->fMark1 = 1;
                Gia_ObjFanin1(pObj)->fMark1 = 1;
            }
        }
        Gia_ManForEachAnd( p, pObj, k )
            Count += pObj->fMark1;
        Counter += Count;

        //printf( "%3d = %8d\n", i, Count );
    }
    Counter /= Vec_WecSize(vPats);
    printf( "Stats over %d patterns: Average care-nodes = %d (%6.2f %%)\n", Vec_WecSize(vPats), (int)Counter, 100.0*(int)Counter/Gia_ManAndNum(p) );
}